

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O3

void recff_io_flush(jit_State *J,RecordFFData *rd)

{
  ulong uVar1;
  TRef TVar2;
  TRef TVar3;
  TRef ud;
  TRef local_14;
  
  TVar2 = recff_io_fp(J,&local_14,rd->data);
  TVar2 = lj_ir_call(J,IRCALL_fflush,(ulong)TVar2);
  uVar1 = J->L->base[-1].u64;
  if (((uVar1 & 3) != 0) || (*(char *)(uVar1 - 1) != '\x01')) {
    TVar3 = lj_ir_kint(J,0);
    (J->fold).ins.field_0.ot = 0x893;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
    lj_opt_fold(J);
  }
  *J->base = 0x2007ffd;
  return;
}

Assistant:

static void LJ_FASTCALL recff_io_flush(jit_State *J, RecordFFData *rd)
{
  TRef ud, fp = recff_io_fp(J, &ud, rd->data);
  TRef tr = lj_ir_call(J, IRCALL_fflush, fp);
  if (results_wanted(J) != 0)  /* Check result only if not ignored. */
    emitir(IRTGI(IR_EQ), tr, lj_ir_kint(J, 0));
  J->base[0] = TREF_TRUE;
}